

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> __thiscall
kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::find<unsigned_long_const&>
          (HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize> *this,unsigned_long *key)

{
  Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> MVar1;
  anon_class_1_0_00000001 local_29;
  Maybe<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry_&> local_28;
  unsigned_long *local_20;
  unsigned_long *key_local;
  HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize> *this_local;
  
  local_20 = key;
  key_local = (unsigned_long *)this;
  local_28 = Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
             ::find<0ul,unsigned_long_const&>
                       ((Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
                         *)this,key);
  MVar1 = Maybe<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry_&>::
          map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj____kj_map_h:358:30)>
                    (&local_28,&local_29);
  return (Maybe<capnp::SchemaLoader::Impl::RequiredSize_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}